

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O1

double inform_shannon_multi_mi(inform_dist *joint,inform_dist **marginals,size_t n,double base)

{
  double dVar1;
  size_t i;
  size_t sVar2;
  double dVar3;
  
  dVar3 = 0.0;
  if (1 < n) {
    dVar3 = inform_shannon_entropy(joint,base);
    dVar3 = -dVar3;
    sVar2 = 0;
    do {
      dVar1 = inform_shannon_entropy(marginals[sVar2],base);
      dVar3 = dVar3 + dVar1;
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
  }
  return dVar3;
}

Assistant:

double inform_shannon_multi_mi(inform_dist const *joint,
    inform_dist const **marginals, size_t n, double base)
{
    if (n < 2)
    {
        return 0.0;
    }
    double pmi = -inform_shannon_entropy(joint, base);
    for (size_t i = 0; i < n; ++i)
    {
        pmi += inform_shannon_entropy(marginals[i], base);
    }
    return pmi;
}